

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PortConnection::serializeTo(PortConnection *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  Compilation *in_RSI;
  size_t *in_RDI;
  Symbol *in_stack_00000028;
  AttributeSymbol *attr;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range3;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  Scope *scope;
  InstanceSymbol *parentInstance;
  Expression *e;
  PortConnection *in_stack_000000e8;
  PortConnection *in_stack_ffffffffffffff28;
  Compilation *symbol;
  Compilation *in_stack_ffffffffffffff30;
  Compilation *in_stack_ffffffffffffff38;
  Compilation *in_stack_ffffffffffffff40;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_98;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_90;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_78;
  Scope *local_68;
  InstanceSymbol *local_60;
  int local_58;
  void *local_50;
  Expression *local_48;
  int local_20;
  void *local_18;
  Compilation *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
             (char *)in_stack_ffffffffffffff38);
  ASTSerializer::write((ASTSerializer *)in_RSI,local_20,local_18,*in_RDI);
  if (*(int *)*in_RDI == 0x2b) {
    if (in_RDI[1] != 0) {
      in_stack_ffffffffffffff40 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
                 (char *)in_stack_ffffffffffffff38);
      ASTSerializer::writeLink((ASTSerializer *)attr,___end3,in_stack_00000028);
    }
    if (in_RDI[3] != 0) {
      in_stack_ffffffffffffff38 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
                 (char *)local_10);
      ASTSerializer::writeLink((ASTSerializer *)attr,___end3,in_stack_00000028);
    }
  }
  else {
    local_48 = getExpression(in_stack_000000e8);
    if (local_48 != (Expression *)0x0) {
      in_stack_ffffffffffffff30 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
                 (char *)in_stack_ffffffffffffff38);
      ASTSerializer::write
                ((ASTSerializer *)in_stack_ffffffffffffff30,local_58,local_50,(size_t)local_48);
    }
  }
  local_60 = getParentInstance((PortConnection *)in_stack_ffffffffffffff30);
  local_68 = Symbol::getParentScope((Symbol *)local_60);
  Scope::getCompilation(local_68);
  local_78 = Compilation::getAttributes(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                     0x513377);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
               (char *)in_stack_ffffffffffffff38);
    name._M_str = (char *)in_RDI;
    name._M_len = (size_t)in_RSI;
    ASTSerializer::startArray((ASTSerializer *)in_stack_ffffffffffffff40,name);
    local_90 = &local_78;
    local_98._M_current =
         (AttributeSymbol **)
         std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                    local_10);
    std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
               in_stack_ffffffffffffff38);
    symbol = local_10;
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                               *)symbol), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
      ::operator*(&local_98);
      ASTSerializer::serialize((ASTSerializer *)in_stack_ffffffffffffff30,(Symbol *)symbol,false);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
      ::operator++(&local_98);
    }
    ASTSerializer::endArray((ASTSerializer *)0x51342d);
  }
  return;
}

Assistant:

void PortConnection::serializeTo(ASTSerializer& serializer) const {
    serializer.write("port", port);
    if (port.kind == SymbolKind::InterfacePort) {
        if (connectedSymbol)
            serializer.writeLink("ifaceInstance", *connectedSymbol);
        if (modport)
            serializer.writeLink("modport", *modport);
    }
    else {
        if (auto e = getExpression())
            serializer.write("expr", *e);
    }

    auto& parentInstance = getParentInstance();
    auto scope = parentInstance.getParentScope();
    SLANG_ASSERT(scope);

    auto attributes = scope->getCompilation().getAttributes(*this);
    if (!attributes.empty()) {
        serializer.startArray("attributes");
        for (auto attr : attributes)
            serializer.serialize(*attr);
        serializer.endArray();
    }
}